

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_nulldoubles(double *fdata,long tilelen,int *idata,int nullcheck,double nullflagval,
                      int nullval,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  int nullval_local;
  double nullflagval_local;
  int nullcheck_local;
  int *idata_local;
  long tilelen_local;
  double *fdata_local;
  
  if (nullcheck == 1) {
    for (ii = 0; ii < tilelen; ii = ii + 1) {
      if ((fdata[ii] != nullflagval) || (NAN(fdata[ii]) || NAN(nullflagval))) {
        dVar1 = fdata[ii];
        if (-2147483648.49 <= dVar1) {
          if (dVar1 <= 2147483647.49) {
            if (dVar1 < 0.0) {
              idata[ii] = (int)(dVar1 - 0.5);
            }
            else {
              idata[ii] = (int)(dVar1 + 0.5);
            }
          }
          else {
            *status = -0xb;
            idata[ii] = 0x7fffffff;
          }
        }
        else {
          *status = -0xb;
          idata[ii] = -0x80000000;
        }
      }
      else {
        idata[ii] = nullval;
      }
    }
  }
  else {
    for (ii = 0; ii < tilelen; ii = ii + 1) {
      dVar1 = fdata[ii];
      if (-2147483648.49 <= dVar1) {
        if (dVar1 <= 2147483647.49) {
          if (dVar1 < 0.0) {
            idata[ii] = (int)(dVar1 - 0.5);
          }
          else {
            idata[ii] = (int)(dVar1 + 0.5);
          }
        }
        else {
          *status = -0xb;
          idata[ii] = 0x7fffffff;
        }
      }
      else {
        *status = -0xb;
        idata[ii] = -0x80000000;
      }
    }
  }
  return *status;
}

Assistant:

int imcomp_nulldoubles(
     double *fdata,
     long tilelen,
     int *idata, 
     int nullcheck,
     double nullflagval,
     int nullval,
     int *status)
/*
   do null value substitution  of the float array.
   If array value = nullflagval, then set the output value to FLOATNULLVALUE.
   Otherwise, inverse scale the integer value.
*/
{
    long ii;
    double dvalue;
    
    if (nullcheck == 1) /* must check for null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
        if (fdata[ii] == nullflagval)
	    idata[ii] = nullval;
	else 
	{
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
        }
      }
    }
    else  /* don't have to worry about null values */
    {
      for (ii=0; ii < tilelen; ii++)
      {
            dvalue = fdata[ii];

            if (dvalue < DINT_MIN)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MIN;
            }
            else if (dvalue > DINT_MAX)
            {
                *status = OVERFLOW_ERR;
                idata[ii] = INT32_MAX;
            }
            else
            {
                if (dvalue >= 0.)
                    idata[ii] = (int) (dvalue + .5);
                else
                    idata[ii] = (int) (dvalue - .5);
            }
      }
    }
    return(*status);
}